

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O3

void traverse_itree_no_recurse<PredictionData<double,unsigned_long>,unsigned_long>
               (vector<IsoTree,_std::allocator<IsoTree>_> *tree,IsoForest *model_outputs,
               PredictionData<double,_unsigned_long> *prediction_data,double *output_depth,
               unsigned_long *tree_num,double *tree_depth,size_t row)

{
  double dVar1;
  pointer pIVar2;
  pointer pcVar3;
  pointer pcVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  size_t *psVar9;
  pointer pIVar10;
  
  pIVar2 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar10 = pIVar2;
  if (pIVar2->tree_left == 0) {
    sVar8 = 0;
  }
  else {
    psVar9 = &pIVar2->tree_left;
    sVar8 = 0;
    do {
      if (pIVar10->col_type == Categorical) {
        lVar5 = pIVar10->col_num + prediction_data->ncols_categ * row;
        if ((prediction_data->is_col_major & 1U) != 0) {
          lVar5 = prediction_data->nrows * pIVar10->col_num + row;
        }
        iVar7 = prediction_data->categ_data[lVar5];
        if (model_outputs->cat_split_type == SingleCateg) {
          if (iVar7 != pIVar10->chosen_cat) goto LAB_0014bb19;
          goto LAB_0014bb20;
        }
        if (model_outputs->cat_split_type == SubSet) {
          pcVar3 = (pIVar10->cat_split).
                   super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar4 = *(pointer *)
                    ((long)&(pIVar10->cat_split).
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl +
                    8);
          if (pcVar3 == pcVar4) {
            if (iVar7 < 2) {
              if (iVar7 != 0) {
LAB_0014bb19:
                psVar9 = &pIVar10->tree_right;
              }
            }
            else if (0.5 < pIVar10->pct_tree_left || pIVar10->pct_tree_left == 0.5)
            goto LAB_0014bb19;
            goto LAB_0014bb20;
          }
          iVar6 = (int)pcVar4;
          if (model_outputs->new_cat_action == Smallest) {
            if (iVar7 < iVar6 - (int)pcVar3) {
              if (pcVar3[iVar7] == '\0') {
LAB_0014bb5d:
                psVar9 = &pIVar10->tree_right;
              }
            }
            else if (0.5 < pIVar10->pct_tree_left || pIVar10->pct_tree_left == 0.5)
            goto LAB_0014bb5d;
            goto LAB_0014bb20;
          }
          if (model_outputs->new_cat_action == Random) {
            iVar6 = iVar6 - (int)pcVar3;
            if (iVar6 <= iVar7) {
              iVar7 = iVar7 % iVar6;
            }
            if (pcVar3[iVar7] == '\0') goto LAB_0014bb19;
            goto LAB_0014bb20;
          }
        }
      }
      else {
        if (pIVar10->col_type != Numeric) goto LAB_0014bb23;
        lVar5 = pIVar10->col_num + prediction_data->ncols_numeric * row;
        if ((prediction_data->is_col_major & 1U) != 0) {
          lVar5 = prediction_data->nrows * pIVar10->col_num + row;
        }
        if (pIVar10->num_split < prediction_data->numeric_data[lVar5]) goto LAB_0014bb19;
LAB_0014bb20:
        sVar8 = *psVar9;
      }
LAB_0014bb23:
      pIVar10 = pIVar2 + sVar8;
      psVar9 = &pIVar2[sVar8].tree_left;
    } while (*psVar9 != 0);
  }
  dVar1 = pIVar10->score;
  *output_depth = *output_depth + dVar1;
  if (tree_num != (unsigned_long *)0x0) {
    tree_num[row] = sVar8;
  }
  if (tree_depth != (double *)0x0) {
    *tree_depth = dVar1;
  }
  return;
}

Assistant:

void traverse_itree_no_recurse(std::vector<IsoTree>  &tree,
                               IsoForest             &model_outputs,
                               PredictionData        &prediction_data,
                               double &restrict      output_depth,
                               sparse_ix *restrict   tree_num,
                               double *restrict      tree_depth,
                               size_t                row) noexcept
{
    size_t curr_lev = 0;
    double xval;
    int    cval;
    while (true)
    {
        // if (tree[curr_lev].score > 0)
        if (unlikely(tree[curr_lev].tree_left == 0))
        {
            output_depth += tree[curr_lev].score;
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = tree[curr_lev].score;
            break;
        }

        else
        {
            switch (tree[curr_lev].col_type)
            {
                case Numeric:
                {
                    xval =  prediction_data.numeric_data[
                                prediction_data.is_col_major?
                                (row + tree[curr_lev].col_num * prediction_data.nrows)
                                    :
                                (tree[curr_lev].col_num + row * prediction_data.ncols_numeric)
                            ];
                    curr_lev = (xval <= tree[curr_lev].num_split)?
                                tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                    break;
                }

                case Categorical:
                {
                    cval =  prediction_data.categ_data[
                                prediction_data.is_col_major?
                                (row +  tree[curr_lev].col_num * prediction_data.nrows)
                                    :
                                (tree[curr_lev].col_num + row * prediction_data.ncols_categ)
                            ];
                    switch (model_outputs.cat_split_type)
                    {
                        case SubSet:
                        {

                            if (tree[curr_lev].cat_split.empty()) /* this is for binary columns */
                            {
                                if (cval <= 1)
                                {
                                    curr_lev = (cval == 0)?
                                                tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                }

                                else /* can only work with 'Smallest' + no NAs if reaching this point */
                                {
                                    curr_lev =  (tree[curr_lev].pct_tree_left < .5)? tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                }
                            }

                            else
                            {

                                switch (model_outputs.new_cat_action)
                                {
                                    case Random:
                                    {
                                        cval = (cval >= (int)tree[curr_lev].cat_split.size())?
                                                (cval % (int)tree[curr_lev].cat_split.size()) : cval;
                                        curr_lev = (tree[curr_lev].cat_split[cval])?
                                                    tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                        break;
                                    }

                                    case Smallest:
                                    {
                                        if (unlikely(cval >= (int)tree[curr_lev].cat_split.size()))
                                        {
                                            curr_lev =  (tree[curr_lev].pct_tree_left < .5)? tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                        }

                                        else
                                        {
                                            curr_lev = (tree[curr_lev].cat_split[cval])?
                                                        tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                        }
                                        break;
                                    }

                                    default:
                                    {
                                        assert(0);
                                        break;
                                    }
                                }
                            }
                            break;
                        }

                        case SingleCateg:
                        {
                            curr_lev = (cval == tree[curr_lev].chosen_cat)?
                                        tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                            break;
                        }
                    }
                    break;
                }

                default:
                {
                    assert(0);
                    break;
                }
            }
        }
    }
}